

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall xmrig::Client::setState(Client *this,SocketState state)

{
  uint64_t uVar1;
  int in_ESI;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x1e8) != in_ESI) {
    if (in_ESI == 1) {
      *(undefined8 *)(in_RDI + 0x4ab8) = 0;
    }
    else if (in_ESI == 2) {
      uVar1 = Chrono::steadyMSecs();
      *(uint64_t *)(in_RDI + 0x4ab8) = uVar1 + 20000;
    }
    else if (in_ESI == 5) {
      uVar1 = Chrono::steadyMSecs();
      *(uint64_t *)(in_RDI + 0x4ab8) = uVar1 + *(long *)(in_RDI + 0x260);
    }
    *(int *)(in_RDI + 0x1e8) = in_ESI;
  }
  return;
}

Assistant:

void xmrig::Client::setState(SocketState state)
{
    LOG_DEBUG("[%s] state: \"%s\"", url(), states[state]);

    if (m_state == state) {
        return;
    }

    switch (state) {
    case HostLookupState:
        m_expire = 0;
        break;

    case ConnectingState:
        m_expire = Chrono::steadyMSecs() + kConnectTimeout;
        break;

    case ReconnectingState:
        m_expire = Chrono::steadyMSecs() + m_retryPause;
        break;

    default:
        break;
    }

    m_state = state;
}